

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_dc_predictor_8x32_c(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined4 uVar1;
  undefined1 auVar2 [13];
  undefined1 auVar3 [13];
  undefined1 auVar4 [13];
  undefined1 auVar5 [13];
  undefined1 auVar6 [13];
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  ulong uVar11;
  ulong uVar12;
  undefined1 auVar13 [13];
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  int iVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  
  uVar1 = *(undefined4 *)above;
  uVar11 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
  auVar2._8_4_ = 0;
  auVar2._0_8_ = uVar11;
  auVar2[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar3[8] = (char)((uint)uVar1 >> 0x10);
  auVar3._0_8_ = uVar11;
  auVar3[9] = 0;
  auVar3._10_3_ = auVar2._10_3_;
  auVar13._5_8_ = 0;
  auVar13._0_5_ = auVar3._8_5_;
  auVar4[4] = (char)((uint)uVar1 >> 8);
  auVar4._0_4_ = (int)uVar11;
  auVar4[5] = 0;
  auVar4._6_7_ = SUB137(auVar13 << 0x40,6);
  uVar1 = *(undefined4 *)(above + 4);
  uVar12 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
  auVar5._8_4_ = 0;
  auVar5._0_8_ = uVar12;
  auVar5[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar6[8] = (char)((uint)uVar1 >> 0x10);
  auVar6._0_8_ = uVar12;
  auVar6[9] = 0;
  auVar6._10_3_ = auVar5._10_3_;
  auVar14._5_8_ = 0;
  auVar14._0_5_ = auVar6._8_5_;
  auVar7[4] = (char)((uint)uVar1 >> 8);
  auVar7._0_4_ = (int)uVar12;
  auVar7[5] = 0;
  auVar7._6_7_ = SUB137(auVar14 << 0x40,6);
  iVar21 = (uint)(uint3)(auVar5._10_3_ >> 0x10) + (uint)(uint3)(auVar2._10_3_ >> 0x10) +
           auVar7._4_4_ + auVar4._4_4_ + auVar6._8_4_ + auVar3._8_4_ + (int)uVar12 + (int)uVar11;
  iVar18 = 0;
  iVar19 = 0;
  iVar20 = 0;
  lVar17 = 0;
  do {
    uVar1 = *(undefined4 *)(left + lVar17);
    uVar11 = (ulong)(ushort)uVar1 & 0xffffffffffff00ff;
    auVar8._8_4_ = 0;
    auVar8._0_8_ = uVar11;
    auVar8[0xc] = (char)((uint)uVar1 >> 0x18);
    auVar9[8] = (char)((uint)uVar1 >> 0x10);
    auVar9._0_8_ = uVar11;
    auVar9[9] = 0;
    auVar9._10_3_ = auVar8._10_3_;
    auVar15._5_8_ = 0;
    auVar15._0_5_ = auVar9._8_5_;
    auVar10[4] = (char)((uint)uVar1 >> 8);
    auVar10._0_4_ = (int)uVar11;
    auVar10[5] = 0;
    auVar10._6_7_ = SUB137(auVar15 << 0x40,6);
    iVar21 = iVar21 + (int)uVar11;
    iVar18 = iVar18 + auVar10._4_4_;
    iVar19 = iVar19 + auVar9._8_4_;
    iVar20 = iVar20 + (uint)(uint3)(auVar8._10_3_ >> 0x10);
    lVar17 = lVar17 + 4;
  } while (lVar17 != 0x20);
  iVar16 = 0x20;
  do {
    *(ulong *)dst =
         (ulong)((iVar20 + iVar18 + iVar19 + iVar21 + 0x14U >> 3) * 0x3334 >> 0x10 & 0xff) *
         0x101010101010101;
    dst = (uint8_t *)((long)dst + stride);
    iVar16 = iVar16 + -1;
  } while (iVar16 != 0);
  return;
}

Assistant:

static inline void dc_predictor_rect(uint8_t *dst, ptrdiff_t stride, int bw,
                                     int bh, const uint8_t *above,
                                     const uint8_t *left, int shift1,
                                     int multiplier) {
  int sum = 0;

  for (int i = 0; i < bw; i++) {
    sum += above[i];
  }
  for (int i = 0; i < bh; i++) {
    sum += left[i];
  }

  const int expected_dc = divide_using_multiply_shift(
      sum + ((bw + bh) >> 1), shift1, multiplier, DC_SHIFT2);
  assert(expected_dc < (1 << 8));

  for (int r = 0; r < bh; r++) {
    memset(dst, expected_dc, bw);
    dst += stride;
  }
}